

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

int mz_compress2(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong source_len,int level)

{
  int local_ac;
  undefined1 local_a8 [8];
  mz_stream stream;
  int status;
  int level_local;
  mz_ulong source_len_local;
  uchar *pSource_local;
  mz_ulong *pDest_len_local;
  uchar *pDest_local;
  
  stream.reserved._4_4_ = level;
  memset(local_a8,0,0x70);
  if ((source_len | *pDest_len) < 0x100000000) {
    stream.next_in._0_4_ = (undefined4)source_len;
    stream.next_out._0_4_ = (undefined4)*pDest_len;
    local_a8 = (undefined1  [8])pSource;
    stream.total_in = (mz_ulong)pDest;
    stream.reserved._0_4_ = mz_deflateInit((mz_streamp)local_a8,stream.reserved._4_4_);
    pDest_local._4_4_ = (int)stream.reserved;
    if ((int)stream.reserved == 0) {
      stream.reserved._0_4_ = mz_deflate((mz_streamp)local_a8,4);
      if ((int)stream.reserved == 1) {
        *pDest_len = stream._32_8_;
        pDest_local._4_4_ = mz_deflateEnd((mz_streamp)local_a8);
      }
      else {
        mz_deflateEnd((mz_streamp)local_a8);
        if ((int)stream.reserved == 0) {
          local_ac = -5;
        }
        else {
          local_ac = (int)stream.reserved;
        }
        pDest_local._4_4_ = local_ac;
      }
    }
  }
  else {
    pDest_local._4_4_ = -10000;
  }
  return pDest_local._4_4_;
}

Assistant:

int mz_compress2(unsigned char *pDest, mz_ulong *pDest_len, const unsigned char *pSource, mz_ulong source_len, int level)
{
    int status;
    mz_stream stream;
    memset(&stream, 0, sizeof(stream));

    /* In case mz_ulong is 64-bits (argh I hate longs). */
    if ((source_len | *pDest_len) > 0xFFFFFFFFU)
        return MZ_PARAM_ERROR;

    stream.next_in = pSource;
    stream.avail_in = (mz_uint32)source_len;
    stream.next_out = pDest;
    stream.avail_out = (mz_uint32)*pDest_len;

    status = mz_deflateInit(&stream, level);
    if (status != MZ_OK)
        return status;

    status = mz_deflate(&stream, MZ_FINISH);
    if (status != MZ_STREAM_END)
    {
        mz_deflateEnd(&stream);
        return (status == MZ_OK) ? MZ_BUF_ERROR : status;
    }

    *pDest_len = stream.total_out;
    return mz_deflateEnd(&stream);
}